

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TAPReporter::testRunEnded(TAPReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  
  poVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"1..",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((_testRunStats->totals).testCases.failed + (_testRunStats->totals).testCases.passed +
      (_testRunStats->totals).testCases.failedButOk + (_testRunStats->totals).testCases.skipped == 0
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
               " # Skipped: No tests ran.",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"\n\n",2);
  std::ostream::flush();
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void TAPReporter::testRunEnded(TestRunStats const& _testRunStats) {
        m_stream << "1.." << _testRunStats.totals.assertions.total();
        if (_testRunStats.totals.testCases.total() == 0) {
            m_stream << " # Skipped: No tests ran.";
        }
        m_stream << "\n\n" << std::flush;
        StreamingReporterBase::testRunEnded(_testRunStats);
    }